

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O0

void __thiscall
Storage::Tape::TapePlayer::set_tape(TapePlayer *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  shared_ptr<Storage::Tape::Tape> *tape_local;
  TapePlayer *this_local;
  
  std::shared_ptr<Storage::Tape::Tape>::operator=(&this->tape_,tape);
  TimedEventLoop::reset_timer(&this->super_TimedEventLoop);
  get_next_pulse(this);
  ClockingHint::Source::update_clocking_observer(&this->super_Source);
  return;
}

Assistant:

void TapePlayer::set_tape(std::shared_ptr<Storage::Tape::Tape> tape) {
	tape_ = tape;
	reset_timer();
	get_next_pulse();
	update_clocking_observer();
}